

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_old_swift_struct_writer
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  pointer pptVar4;
  char *pcVar5;
  string name;
  string local_90;
  string visibility;
  string local_50;
  
  pcVar5 = "public";
  if ((int)CONCAT71(in_register_00000009,is_private) != 0) {
    pcVar5 = "private";
  }
  std::__cxx11::string::string((string *)&visibility,pcVar5,(allocator *)&name);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)&visibility);
  poVar3 = std::operator<<(poVar3," static func writeValue(__value: ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar3,", toProtocol __proto: TProtocol) throws");
  block_open(this,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&name,(string *)CONCAT44(extraout_var_00,iVar2));
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"try __proto.writeStructBeginWithName(\"");
  poVar3 = std::operator<<(poVar3,(string *)&name);
  poVar3 = std::operator<<(poVar3,"\")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    tfield = *pptVar4;
    bVar1 = field_is_optional(this,tfield);
    if (bVar1) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"if let ");
      maybe_escape_identifier(&local_50,this,&tfield->name_);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      poVar3 = std::operator<<(poVar3," = __value.");
      maybe_escape_identifier(&local_90,this,&tfield->name_);
      std::operator<<(poVar3,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      block_open(this,out);
    }
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"try __proto.writeFieldValue(");
    pcVar5 = "__value.";
    if (bVar1) {
      pcVar5 = "";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    maybe_escape_identifier(&local_50,this,&tfield->name_);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"name: \"");
    poVar3 = std::operator<<(poVar3,(string *)&tfield->name_);
    poVar3 = std::operator<<(poVar3,"\", ");
    poVar3 = std::operator<<(poVar3,"type: ");
    type_to_enum_abi_cxx11_(&local_90,this,tfield->type_,false);
    poVar3 = std::operator<<(poVar3,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"id: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,tfield->key_);
    poVar3 = std::operator<<(poVar3,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      block_close(this,out,true);
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"try __proto.writeFieldStop()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"try __proto.writeStructEnd()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&visibility);
  return;
}

Assistant:

void t_swift_generator::generate_old_swift_struct_writer(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_private) {

  string visibility = is_private ? "private" : "public";

  indent(out) << visibility << " static func writeValue(__value: " << tstruct->get_name()
              << ", toProtocol __proto: TProtocol) throws";
  block_open(out);
  out << endl;

  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "try __proto.writeStructBeginWithName(\"" << name << "\")" << endl;
  out << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field *tfield = *f_iter;

    bool optional = field_is_optional(tfield);
    if (optional) {
      indent(out) << "if let " << maybe_escape_identifier(tfield->get_name())
                  << " = __value." << maybe_escape_identifier(tfield->get_name());
      block_open(out);
    }

    indent(out) << "try __proto.writeFieldValue("
                << (optional ? "" : "__value.") << maybe_escape_identifier(tfield->get_name()) << ", "
                << "name: \"" << tfield->get_name() << "\", "
                << "type: " << type_to_enum(tfield->get_type()) << ", "
                << "id: " << tfield->get_key() << ")" << endl;

    if (optional) {
      block_close(out);
    }

    out << endl;
  }

  indent(out) << "try __proto.writeFieldStop()" << endl << endl;
  indent(out) << "try __proto.writeStructEnd()" << endl;
  block_close(out);
  out << endl;
}